

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_util.hpp
# Opt level: O3

string * __thiscall
rest_rpc::get_error_msg_abi_cxx11_(string *__return_storage_ptr__,rest_rpc *this,string_view result)

{
  pointer *__ptr;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> tp;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined1 local_30 [24];
  _Head_base<0UL,_msgpack::v1::zone_*,_false> local_18;
  
  local_30._0_4_ = NIL;
  local_18._M_head_impl = (zone *)0x0;
  rpc_service::msgpack_codec::unpack<std::tuple<int,std::__cxx11::string>>
            (&local_58,(msgpack_codec *)local_30,(char *)this,(size_t)result.data_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,
             local_58.
             super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus._M_p,
             local_58.
             super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus._M_p +
             local_58.
             super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.
         super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &local_58.
       super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .
       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(local_58.
                    super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if (local_18._M_head_impl != (zone *)0x0) {
    std::default_delete<msgpack::v1::zone>::operator()
              ((default_delete<msgpack::v1::zone> *)&local_18,local_18._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string get_error_msg(string_view result) {
  rpc_service::msgpack_codec codec;
  auto tp =
      codec.unpack<std::tuple<int, std::string>>(result.data(), result.size());
  return std::get<1>(tp);
}